

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void insert_timer(level *lev,timer_element *gnu)

{
  timer_element *local_28;
  timer_element *prev;
  timer_element *curr;
  timer_element *gnu_local;
  level *lev_local;
  
  local_28 = (timer_element *)0x0;
  for (prev = lev->lev_timers; (prev != (timer_element *)0x0 && (prev->timeout < gnu->timeout));
      prev = prev->next) {
    local_28 = prev;
  }
  gnu->next = prev;
  if (local_28 == (timer_element *)0x0) {
    lev->lev_timers = gnu;
  }
  else {
    local_28->next = gnu;
  }
  return;
}

Assistant:

static void insert_timer(struct level *lev, timer_element *gnu)
{
    timer_element *curr, *prev;

    for (prev = 0, curr = lev->lev_timers; curr; prev = curr, curr = curr->next)
	if (curr->timeout >= gnu->timeout) break;

    gnu->next = curr;
    if (prev)
	prev->next = gnu;
    else
	lev->lev_timers = gnu;
}